

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_openssl.c
# Opt level: O0

int x509_openssl_add_credentials
              (SSL_CTX *ssl_ctx,char *x509certificate,char *x509privatekey,
              OPTION_OPENSSL_KEY_TYPE x509privatekeytype,ENGINE *engine)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar3;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  ENGINE *engine_local;
  OPTION_OPENSSL_KEY_TYPE x509privatekeytype_local;
  char *x509privatekey_local;
  char *x509certificate_local;
  SSL_CTX *ssl_ctx_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (((ssl_ctx == (SSL_CTX *)0x0) || (x509certificate == (char *)0x0)) ||
     (x509privatekey == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/x509_openssl.c"
                ,"x509_openssl_add_credentials",0x129,1,
                "invalid parameter detected: ssl_ctx=%p, x509certificate=%p, x509privatekey=%p",
                ssl_ctx,x509certificate,x509privatekey);
    }
    l._4_4_ = 0x12a;
  }
  else if ((x509privatekeytype == KEY_TYPE_ENGINE) && (engine == (ENGINE *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/x509_openssl.c"
                ,"x509_openssl_add_credentials",0x12f,1,
                "OpenSSL Engine must be configured when KEY_TYPE_ENGINE is used.");
    }
    l._4_4_ = 0x130;
  }
  else {
    if (x509privatekeytype == KEY_TYPE_DEFAULT) {
      l._4_4_ = x509_openssl_add_pem_file_key(ssl_ctx,x509privatekey);
    }
    else if (x509privatekeytype == KEY_TYPE_ENGINE) {
      l._4_4_ = x509_openssl_add_engine_key(ssl_ctx,x509privatekey,engine);
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/x509_openssl.c"
                  ,"x509_openssl_add_credentials",0x142,1,
                  "Unexpected value of OPTION_OPENSSL_KEY_TYPE (%d)",
                  CONCAT44(uVar3,x509privatekeytype));
      }
      l._4_4_ = 0x143;
    }
    if ((l._4_4_ == 0) && (iVar1 = load_certificate_chain(ssl_ctx,x509certificate), iVar1 != 0)) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/x509_openssl.c"
                  ,"x509_openssl_add_credentials",0x14a,1,"failure loading public cert or chain");
      }
      l._4_4_ = 0x14b;
    }
  }
  return l._4_4_;
}

Assistant:

int x509_openssl_add_credentials(
    SSL_CTX* ssl_ctx,
    const char* x509certificate,
    const char* x509privatekey,
    OPTION_OPENSSL_KEY_TYPE x509privatekeytype)
#endif // OPENSSL_NO_ENGINE
{
    int result;
    if (ssl_ctx == NULL || x509certificate == NULL || x509privatekey == NULL)
    {
        /*Codes_SRS_X509_OPENSSL_02_009: [ Otherwise x509_openssl_add_credentials shall fail and return a non-zero number. ]*/
        LogError("invalid parameter detected: ssl_ctx=%p, x509certificate=%p, x509privatekey=%p", ssl_ctx, x509certificate, x509privatekey);
        result = MU_FAILURE;
    }
#ifndef OPENSSL_NO_ENGINE
    else if ((x509privatekeytype == KEY_TYPE_ENGINE) && (engine == NULL))
    {
        LogError("OpenSSL Engine must be configured when KEY_TYPE_ENGINE is used.");
        result = MU_FAILURE;
    }
#endif // OPENSSL_NO_ENGINE
    else
    {
        // Configure private key.
        if (x509privatekeytype == KEY_TYPE_DEFAULT)
        {
            result = x509_openssl_add_pem_file_key(ssl_ctx, x509privatekey);
        }
        #ifndef OPENSSL_NO_ENGINE
        else if (x509privatekeytype == KEY_TYPE_ENGINE)
        {
            result = x509_openssl_add_engine_key(ssl_ctx, x509privatekey, engine);
        }
        #endif // OPENSSL_NO_ENGINE
        else
        {
            LogError("Unexpected value of OPTION_OPENSSL_KEY_TYPE (%d)", x509privatekeytype);
            result = MU_FAILURE;
        }

        if (result == 0)
        {
            if (load_certificate_chain(ssl_ctx, x509certificate) != 0)
            {
                LogError("failure loading public cert or chain");
                result = MU_FAILURE;
            }
        }
    }

    return result;
}